

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void kj::_::Debug::log<char_const(&)[65]>
               (char *file,int line,LogSeverity severity,char *macroArgs,char (*params) [65])

{
  undefined4 in_register_00000014;
  ArrayPtr<kj::String> in_stack_ffffffffffffffb8;
  
  str<char_const(&)[65]>
            ((String *)&stack0xffffffffffffffb8,(kj *)params,
             (char (*) [65])CONCAT44(in_register_00000014,severity));
  logInternal((Debug *)file,(char *)(ulong)(uint)line,severity,(LogSeverity)macroArgs,
              &stack0xffffffffffffffb8,in_stack_ffffffffffffffb8);
  Array<char>::~Array((Array<char> *)&stack0xffffffffffffffb8);
  return;
}

Assistant:

void Debug::log(const char* file, int line, LogSeverity severity, const char* macroArgs,
                Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  logInternal(file, line, severity, macroArgs, arrayPtr(argValues, sizeof...(Params)));
}